

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<char,_false>_> __thiscall
immutable::rrb_details::execute_concat_plan<char,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<char,_false>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  char cVar1;
  uint32_t uVar2;
  ref<immutable::rrb_details::internal_node<char,_false>_> *prVar3;
  internal_node<char,_false> *piVar4;
  leaf_node<char,_false> *plVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint32_t uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old_node;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_node;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_88;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_80;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_78;
  ulong local_70;
  internal_node<char,_false> *local_68;
  ref<immutable::rrb_details::internal_node<char,_false>_> *local_60;
  ulong local_58;
  uint32_t local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  ulong local_40;
  rrb_details local_38 [8];
  
  local_60 = all;
  local_48 = node_size;
  piVar4 = internal_node_create<char,false>(slen);
  *(internal_node<char,_false> **)this = piVar4;
  if (piVar4 != (internal_node<char,_false> *)0x0) {
    piVar4->_ref_count = 1;
  }
  local_40 = (ulong)slen;
  local_68 = (internal_node<char,_false> *)this;
  if (shift == 6) {
    uVar13 = 0;
    uVar8 = 0;
    for (uVar7 = 0; uVar7 != local_40; uVar7 = uVar7 + 1) {
      uVar2 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(local_60);
      local_78.ptr = piVar4->child[uVar8].ptr;
      if (local_78.ptr != (internal_node<char,_false> *)0x0) {
        (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
      }
      if (uVar13 == 0) {
        plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_78);
        if (uVar2 != plVar5->len) goto LAB_0014d53e;
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)local_68);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)(piVar4->child + uVar7)
                   ,(ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_78);
        uVar8 = uVar8 + 1;
        uVar13 = 0;
      }
      else {
LAB_0014d53e:
        local_58 = uVar7;
        local_80.ptr = (internal_node<char,_false> *)leaf_node_create<char,false>(uVar2);
        if (local_80.ptr != (internal_node<char,_false> *)0x0) {
          (local_80.ptr)->_ref_count = 1;
        }
        uVar7 = 0;
        while( true ) {
          uVar9 = (uint)uVar7;
          uVar6 = uVar2 - uVar9;
          if (uVar2 < uVar9 || uVar6 == 0) break;
          piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(local_60);
          local_88.ptr = piVar4->child[uVar8].ptr;
          if (local_88.ptr != (internal_node<char,_false> *)0x0) {
            (local_88.ptr)->_ref_count = (local_88.ptr)->_ref_count + 1;
          }
          plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                             ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_88);
          if (uVar6 < plVar5->len - uVar13) {
            uVar12 = (ulong)uVar6;
            uVar9 = uVar13;
            while( true ) {
              bVar14 = uVar12 == 0;
              uVar12 = uVar12 - 1;
              if (bVar14) break;
              plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_88)
              ;
              cVar1 = plVar5->child[uVar9];
              plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_80)
              ;
              plVar5->child[uVar7] = cVar1;
              uVar7 = (ulong)((int)uVar7 + 1);
              uVar9 = uVar9 + 1;
            }
            uVar13 = uVar13 + uVar6;
            uVar6 = uVar2;
          }
          else {
            uVar12 = 0;
            local_70 = uVar7;
            while( true ) {
              plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_88)
              ;
              uVar11 = plVar5->len;
              plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_88)
              ;
              if (uVar11 - uVar13 <= uVar12) break;
              cVar1 = plVar5->child[uVar13 + (int)uVar12];
              plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->
                                 ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_80)
              ;
              plVar5->child[(uint)((int)local_70 + (int)uVar12)] = cVar1;
              uVar12 = uVar12 + 1;
            }
            uVar6 = (uVar9 - uVar13) + plVar5->len;
            uVar8 = uVar8 + 1;
            uVar13 = 0;
          }
          uVar7 = (ulong)uVar6;
          release<char>((leaf_node<char,_false> *)local_88.ptr);
        }
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)local_68);
        uVar7 = local_58;
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)
                   (piVar4->child + local_58),
                   (ref<immutable::rrb_details::leaf_node<char,_false>_> *)&local_80);
        release<char>((leaf_node<char,_false> *)local_80.ptr);
      }
      release<char>((leaf_node<char,_false> *)local_78.ptr);
    }
  }
  else {
    local_4c = shift - 6;
    iVar10 = 0;
    uVar12 = 0;
    for (uVar7 = 0; uVar7 != local_40; uVar7 = uVar7 + 1) {
      uVar2 = (local_48->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(local_60);
      local_78.ptr = piVar4->child[uVar12].ptr;
      if (local_78.ptr != (internal_node<char,_false> *)0x0) {
        (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
      }
      if (iVar10 == 0) {
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_78);
        if (uVar2 != piVar4->len) goto LAB_0014d743;
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)local_68);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (piVar4->child + uVar7,&local_78);
        uVar12 = (ulong)((int)uVar12 + 1);
        iVar10 = 0;
      }
      else {
LAB_0014d743:
        local_70 = CONCAT44(local_70._4_4_,iVar10);
        local_58 = uVar7;
        local_80.ptr = internal_node_create<char,false>(uVar2);
        if (local_80.ptr != (internal_node<char,_false> *)0x0) {
          (local_80.ptr)->_ref_count = 1;
        }
        uVar11 = 0;
        while (uVar8 = uVar2 - uVar11, uVar11 <= uVar2 && uVar8 != 0) {
          piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(local_60);
          local_88.ptr = piVar4->child[uVar12].ptr;
          if (local_88.ptr != (internal_node<char,_false> *)0x0) {
            (local_88.ptr)->_ref_count = (local_88.ptr)->_ref_count + 1;
          }
          piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&local_88);
          uVar13 = (uint)local_70;
          if (uVar8 < piVar4->len - (uint)local_70) {
            uVar7 = (ulong)uVar8;
            while (bVar14 = uVar7 != 0, uVar7 = uVar7 - 1, bVar14) {
              piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                 (&local_88);
              prVar3 = piVar4->child;
              piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                 (&local_80);
              ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                        (piVar4->child + uVar11,prVar3 + uVar13);
              uVar11 = uVar11 + 1;
              uVar13 = uVar13 + 1;
            }
            local_70 = CONCAT44(local_70._4_4_,(uint)local_70 + uVar8);
            uVar11 = uVar2;
          }
          else {
            uVar7 = 0;
            while( true ) {
              piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                 (&local_88);
              uVar8 = piVar4->len - (uint)local_70;
              piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                 (&local_88);
              if (uVar8 <= uVar7) break;
              prVar3 = piVar4->child;
              piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                                 (&local_80);
              ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                        (piVar4->child + (uVar11 + (int)uVar7),prVar3 + (uVar13 + (int)uVar7));
              uVar7 = uVar7 + 1;
            }
            uVar11 = (uVar11 - (uint)local_70) + piVar4->len;
            uVar12 = (ulong)((int)uVar12 + 1);
            local_70 = local_70 & 0xffffffff00000000;
          }
          ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_88);
        }
        set_sizes<char,false,6>(local_38,&local_80,local_4c);
        uVar7 = local_58;
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<char,_false>_> *)local_38);
        piVar4 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)local_68);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (piVar4->child + uVar7,&local_80);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_80);
        iVar10 = (uint)local_70;
      }
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&local_78);
    }
  }
  return (ref<immutable::rrb_details::internal_node<char,_false>_>)local_68;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }